

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O2

void PatchRandoWorldEdits::replace_sick_merchant_by_chest(World *world)

{
  Map *pMVar1;
  Entity *pEVar2;
  Attributes local_78;
  
  pMVar1 = World::map(world,0x2ba);
  pMVar1->_base_chest_id = '\x0e';
  pMVar1 = World::map(world,0x2ba);
  Map::remove_entity(pMVar1,'\0',true);
  pMVar1 = World::map(world,0x2ba);
  pEVar2 = (Entity *)operator_new(0x58);
  local_78.type_id = '\x12';
  local_78.position.x = '\x0e';
  local_78.position.y = '\x12';
  local_78.position.z = '\0';
  local_78.position.half_x = false;
  local_78.position.half_y = false;
  local_78.position.half_z = false;
  local_78.orientation = '\x03';
  local_78.palette = '\x02';
  local_78.behavior_id = 0;
  local_78.speed = '\0';
  local_78.fightable = false;
  local_78.liftable = false;
  local_78.can_pass_through = false;
  local_78.appear_after_player_moved_away = false;
  local_78.gravity_immune = false;
  local_78.talkable = false;
  local_78.dialogue = '\0';
  local_78.entity_to_use_tiles_from = (Entity *)0x0;
  local_78.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_78.persistence_flag.byte = 0xff;
  local_78.persistence_flag.bit = 0xff;
  local_78.flag_unknown_2_3 = false;
  local_78.flag_unknown_2_4 = false;
  local_78.flag_unknown_3_5 = false;
  Entity::Entity(pEVar2,&local_78);
  Map::add_entity(pMVar1,pEVar2);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_78.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pMVar1 = World::map(world,0x2ba);
  pEVar2 = Map::entity(pMVar1,'\0');
  (pEVar2->_attrs).position.y = '\x15';
  return;
}

Assistant:

static void replace_sick_merchant_by_chest(World& world)
    {
        // Set the index for added chest in map to "0E" instead of "C2"
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->base_chest_id(0x0E);

        // Remove the sick merchant
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->remove_entity(0);

        // Add a chest
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->add_entity(new Entity({
                                                                                     .type_id = ENTITY_CHEST,
                                                                                     .position = Position(14, 18, 0),
                                                                                     .orientation = ENTITY_ORIENTATION_NW,
                                                                                     .palette = 2
                                                                             }));

        // Move the kid to hide the fact that the bed looks broken af
        world.map(MAP_MERCATOR_SPECIAL_SHOP_BACKROOM)->entity(0)->position().y = 21;

//   Bed tile GFX swap?
//   rom.set_word(0x0050B4, 0x0008); // Before: 0x2A0C (bit 4 of 102A) | After: 0x0008 (bit 0 of 1000 - always true)
    }